

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# position.cpp
# Opt level: O2

Position __thiscall indk::operator-(indk *this,Position *L,Position *R)

{
  uint uVar1;
  Error *this_00;
  float *extraout_RDX;
  uint i;
  ulong uVar2;
  float fVar3;
  Position PVar4;
  float local_6c;
  vector<float,_std::allocator<float>_> PV;
  _Vector_base<float,_std::allocator<float>_> local_48;
  
  uVar1 = L->DimensionsCount;
  if (uVar1 == R->DimensionsCount) {
    if (L->Xm == R->Xm) {
      PV.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_start
           = (pointer)0x0;
      PV.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data._M_finish
           = (pointer)0x0;
      PV.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      for (uVar2 = 0; uVar2 < uVar1; uVar2 = uVar2 + 1) {
        fVar3 = -1.0;
        if (uVar2 < R->DimensionsCount) {
          fVar3 = R->X[uVar2];
        }
        local_6c = ABS(L->X[uVar2] - fVar3);
        std::vector<float,_std::allocator<float>_>::emplace_back<float>(&PV,&local_6c);
        uVar1 = L->DimensionsCount;
      }
      uVar1 = L->Xm;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&local_48,&PV);
      Position::Position((Position *)this,uVar1,(vector<float,_std::allocator<float>_> *)&local_48);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base(&local_48);
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&PV.super__Vector_base<float,_std::allocator<float>_>);
      PVar4.X = extraout_RDX;
      PVar4._0_8_ = this;
      return PVar4;
    }
    this_00 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this_00,9);
  }
  else {
    this_00 = (Error *)__cxa_allocate_exception(0x28);
    Error::Error(this_00,10);
  }
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

unsigned int indk::Position::getDimensionsCount() const {
    return DimensionsCount;
}